

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tls-client.c
# Opt level: O3

int lws_client_create_tls(lws *wsi,char **pcce,int do_c1)

{
  lws_context *plVar1;
  lws_ssl_capable_status lVar2;
  int iVar3;
  lws_usec_t lVar4;
  char *pcVar5;
  ulong uVar6;
  lws *plVar7;
  lws_vhost *plVar8;
  ulong uVar9;
  
  if (((wsi->tls).use_ssl & 1) == 0) {
    (wsi->tls).ssl = (lws_tls_conn *)0x0;
  }
  else {
    if ((wsi->tls).ssl == (lws_tls_conn *)0x0) {
      if ((wsi->field_0x474 & 0x20) == 0) {
        iVar3 = lws_tls_restrict_borrow((wsi->a).context);
        if (iVar3 != 0) {
          pcVar5 = "tls restriction limit";
          goto LAB_0013251a;
        }
        wsi->field_0x474 = wsi->field_0x474 | 1;
        plVar1 = (wsi->a).context;
        if ((plVar1->ssl_handshake_serialize != 0) &&
           (plVar8 = plVar1->vhost_list, plVar8 != (lws_vhost *)0x0)) {
          uVar6 = (ulong)plVar1->pt[0].fds_count;
          do {
            iVar3 = (int)uVar6;
            uVar6 = 0;
            if (iVar3 != 0) {
              uVar9 = 0;
              do {
                plVar7 = wsi_from_fd(plVar1,plVar1->pt[0].fds[uVar9].fd);
                if ((((plVar7 != (lws *)0x0) && (plVar7->tsi == '\0')) && (plVar7 != wsi)) &&
                   (((plVar7->a).vhost == plVar8 && ((short)plVar7->wsistate != 0x20)))) {
                  lws_tls_restrict_return((wsi->a).context);
                  wsi->field_0x474 = wsi->field_0x474 & 0xfe;
                  pcVar5 = "ssl handshake serialization";
                  goto LAB_0013251a;
                }
                uVar9 = uVar9 + 1;
                uVar6 = (ulong)plVar1->pt[0].fds_count;
              } while (uVar9 < uVar6);
            }
            plVar8 = plVar8->vhost_next;
          } while (plVar8 != (lws_vhost *)0x0);
        }
      }
      iVar3 = lws_ssl_client_bio_create(wsi);
      if (iVar3 < 0) {
        pcVar5 = "bio_create failed";
LAB_0013251a:
        *pcce = pcVar5;
        return -1;
      }
    }
    if (do_c1 != 0) {
      lVar4 = lws_now_usecs();
      wsi->conmon_datum = lVar4;
      plVar1 = (wsi->a).context;
      lVar2 = lws_tls_client_connect
                        (wsi,(char *)plVar1->pt[wsi->tsi].serv_buf,(ulong)plVar1->pt_serv_buf_size);
      switch(lVar2) {
      case LWS_SSL_CAPABLE_DONE:
        lVar4 = lws_now_usecs();
        (wsi->conmon).ciu_tls = (int)lVar4 - (int)wsi->conmon_datum;
        _lws_log(0x10,"%s: lws_ssl_client_connect1: %d\n","lws_client_create_tls",1);
        lws_tls_server_conn_alpn(wsi);
        return 0;
      case LWS_SSL_CAPABLE_MORE_SERVICE_WRITE:
        lws_callback_on_writable(wsi);
      case LWS_SSL_CAPABLE_MORE_SERVICE:
      case LWS_SSL_CAPABLE_MORE_SERVICE_READ:
        lwsi_set_state(wsi,0x204);
      default:
        _lws_log(0x10,"%s: lws_ssl_client_connect1: %d\n","lws_client_create_tls",0);
        return 1;
      case LWS_SSL_CAPABLE_ERROR:
        _lws_log(0x10,"%s: lws_ssl_client_connect1: %d\n","lws_client_create_tls",0xffffffff);
        *pcce = (char *)((wsi->a).context)->pt[wsi->tsi].serv_buf;
        return -1;
      }
    }
  }
  return 0;
}

Assistant:

int
lws_client_create_tls(struct lws *wsi, const char **pcce, int do_c1)
{
	/* we can retry this... just cook the SSL BIO the first time */

	if (wsi->tls.use_ssl & LCCSCF_USE_SSL) {
		int n;

		if (!wsi->tls.ssl) {

#if defined(LWS_WITH_TLS)
			if (!wsi->transaction_from_pipeline_queue) {
				if (lws_tls_restrict_borrow(wsi->a.context)) {
					*pcce = "tls restriction limit";
					return CCTLS_RETURN_ERROR;
				}
				wsi->tls_borrowed = 1;
				if (wsi->a.context->ssl_handshake_serialize) {
					if (lws_ssl_handshake_serialize(wsi->a.context, wsi)) {
						lws_tls_restrict_return(wsi->a.context);
						wsi->tls_borrowed = 0;
						*pcce = "ssl handshake serialization";
						return CCTLS_RETURN_ERROR;
					}
				}
			}
#endif

			if (lws_ssl_client_bio_create(wsi) < 0) {
				*pcce = "bio_create failed";
				return CCTLS_RETURN_ERROR;
			}
		}

		if (!do_c1)
			return CCTLS_RETURN_DONE;

		lws_metrics_caliper_report(wsi->cal_conn, METRES_GO);
		lws_metrics_caliper_bind(wsi->cal_conn, wsi->a.context->mt_conn_tls);
#if defined(LWS_WITH_CONMON)
		wsi->conmon_datum = lws_now_usecs();
#endif

		n = lws_ssl_client_connect1(wsi, (char *)wsi->a.context->pt[(int)wsi->tsi].serv_buf,
					    wsi->a.context->pt_serv_buf_size);
		lwsl_debug("%s: lws_ssl_client_connect1: %d\n", __func__, n);
		if (!n)
			return CCTLS_RETURN_RETRY; /* caller should return 0 */

		if (n < 0) {
			*pcce = (const char *)wsi->a.context->pt[(int)wsi->tsi].serv_buf;
			lws_metrics_caliper_report(wsi->cal_conn, METRES_NOGO);
			return CCTLS_RETURN_ERROR;
		}
		/* ...connect1 already handled caliper if SSL_accept done */

		lws_tls_server_conn_alpn(wsi);

	} else
		wsi->tls.ssl = NULL;

	return CCTLS_RETURN_DONE; /* OK */
}